

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libmeshb7.c
# Opt level: O0

void RecWrd(GmfMshSct *msh,void *wrd)

{
  size_t sVar1;
  void *in_RSI;
  long in_RDI;
  
  sVar1 = fwrite(in_RSI,4,1,*(FILE **)(in_RDI + 0x300410));
  if (sVar1 != 1) {
    longjmp((__jmp_buf_tag *)(in_RDI + 0x48),-0x1c);
  }
  return;
}

Assistant:

static void RecWrd(GmfMshSct *msh, const void *wrd)
{
   // [Bruno] added error control
#ifdef WITH_GMF_AIO
   if(write(msh->FilDes, wrd, WrdSiz) != WrdSiz)
#else
   if(fwrite(wrd, WrdSiz, 1, msh->hdl) != 1)
#endif
      longjmp(msh->err,-28);
}